

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PendingTermsAddOne(Fts3Table *p,int iCol,int iPos,Fts3Hash *pHash,char *zToken,int nToken)

{
  PendingList *pPVar1;
  int iVar2;
  PendingList *pPVar3;
  int local_3c;
  PendingList *pPStack_38;
  int rc;
  PendingList *pList;
  char *pcStack_28;
  int nToken_local;
  char *zToken_local;
  Fts3Hash *pHash_local;
  int iPos_local;
  int iCol_local;
  Fts3Table *p_local;
  
  local_3c = 0;
  pList._4_4_ = nToken;
  pcStack_28 = zToken;
  zToken_local = &pHash->keyClass;
  pHash_local._0_4_ = iPos;
  pHash_local._4_4_ = iCol;
  _iPos_local = p;
  pPStack_38 = (PendingList *)sqlite3Fts3HashFind(pHash,zToken,nToken);
  if (pPStack_38 != (PendingList *)0x0) {
    _iPos_local->nPendingData = _iPos_local->nPendingData - (pPStack_38->nData + pList._4_4_ + 0x28)
    ;
  }
  iVar2 = fts3PendingListAppend
                    (&stack0xffffffffffffffc8,_iPos_local->iPrevDocid,(long)pHash_local._4_4_,
                     (long)(int)pHash_local,&local_3c);
  pPVar1 = pPStack_38;
  if ((iVar2 != 0) &&
     (pPVar3 = (PendingList *)
               sqlite3Fts3HashInsert((Fts3Hash *)zToken_local,pcStack_28,pList._4_4_,pPStack_38),
     pPVar1 == pPVar3)) {
    sqlite3_free(pPStack_38);
    local_3c = 7;
  }
  if (local_3c == 0) {
    _iPos_local->nPendingData = _iPos_local->nPendingData + pPStack_38->nData + pList._4_4_ + 0x28;
  }
  return local_3c;
}

Assistant:

static int fts3PendingTermsAddOne(
  Fts3Table *p,
  int iCol,
  int iPos,
  Fts3Hash *pHash,                /* Pending terms hash table to add entry to */
  const char *zToken,
  int nToken
){
  PendingList *pList;
  int rc = SQLITE_OK;

  pList = (PendingList *)fts3HashFind(pHash, zToken, nToken);
  if( pList ){
    p->nPendingData -= (pList->nData + nToken + sizeof(Fts3HashElem));
  }
  if( fts3PendingListAppend(&pList, p->iPrevDocid, iCol, iPos, &rc) ){
    if( pList==fts3HashInsert(pHash, zToken, nToken, pList) ){
      /* Malloc failed while inserting the new entry. This can only 
      ** happen if there was no previous entry for this token.
      */
      assert( 0==fts3HashFind(pHash, zToken, nToken) );
      sqlite3_free(pList);
      rc = SQLITE_NOMEM;
    }
  }
  if( rc==SQLITE_OK ){
    p->nPendingData += (pList->nData + nToken + sizeof(Fts3HashElem));
  }
  return rc;
}